

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O1

int dice_roll(dice_t *dice,random_value *v)

{
  int iVar1;
  random_value rv;
  random_value local_18;
  
  dice_random_value(dice,&local_18);
  if (v != (random_value *)0x0) {
    v->base = local_18.base;
    v->dice = local_18.dice;
    v->sides = local_18.sides;
    v->m_bonus = local_18.m_bonus;
  }
  iVar1 = damroll(local_18.dice,local_18.sides);
  return iVar1 + local_18.base;
}

Assistant:

int dice_roll(const dice_t *dice, random_value *v)
{
	random_value rv;
	dice_random_value(dice, &rv);

	if (v != NULL) {
		v->base = rv.base;
		v->dice = rv.dice;
		v->sides = rv.sides;
		v->m_bonus = rv.m_bonus;
	}

	return rv.base + damroll(rv.dice, rv.sides);
}